

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> * __thiscall
jessilib::string_cast<char8_t,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
          (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
           *__return_storage_ptr__,jessilib *this,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *in_string)

{
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> in_string_00;
  bool bVar1;
  decode_result dVar2;
  decode_result string_front;
  undefined1 auStack_48 [8];
  InViewT in_string_view;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> result;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *in_string_local;
  
  std::__cxx11::u8string::u8string((u8string *)&in_string_view._M_str);
  auStack_48 = *(undefined1 (*) [8])this;
  in_string_view._M_len = *(size_t *)(this + 8);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_48);
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::reserve
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &in_string_view._M_str,0);
  do {
    bVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::empty
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::u8string::u8string
                ((u8string *)__return_storage_ptr__,
                 (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                 &in_string_view._M_str);
LAB_00303e6c:
      std::__cxx11::u8string::~u8string((u8string *)&in_string_view._M_str);
      return __return_storage_ptr__;
    }
    in_string_00._M_str = (wchar_t *)in_string_view._M_len;
    in_string_00._M_len = (size_t)auStack_48;
    dVar2 = decode_codepoint<wchar_t>(in_string_00);
    if (dVar2.units == 0) {
      std::__cxx11::u8string::u8string((u8string *)__return_storage_ptr__);
      goto LAB_00303e6c;
    }
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::remove_prefix
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_48,dVar2.units);
    encode_codepoint<char8_t>
              ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
               &in_string_view._M_str,dVar2.codepoint);
  } while( true );
}

Assistant:

std::basic_string<OutCharT> string_cast(const InT& in_string) {
	static_assert(impl_unicode::is_string<InT>::value == true);
	using InCharT = std::remove_cvref_t<typename impl_unicode::is_string<InT>::type>;
	using InEquivalentT = typename unicode_traits<InCharT>::equivalent_type;
	using InViewT = std::basic_string_view<InCharT>;
	using OutT = std::basic_string<OutCharT>;

	if constexpr (std::is_same_v<InT, OutT>) {
		// This does nothing at all; consider static_assert against this?
		return in_string;
	}
	else if constexpr (std::is_same_v<OutCharT, InCharT>
	    || std::is_same_v<OutCharT, InEquivalentT>) {
		// Just do a dumb copy when same or equivalent char types; should be faster than re-encoding
		if constexpr (impl_unicode::is_string<InT>::is_container) {
			return { reinterpret_cast<const OutCharT*>(in_string.data()), in_string.size() };
		}
		else if constexpr (impl_unicode::is_string<InT>::is_fixed_array) {
			return { reinterpret_cast<const OutCharT*>(in_string), std::size(in_string) - 1 }; // strip null term
		}
		else {
			return { reinterpret_cast<const OutCharT*>(in_string) };
		}
	}
	else {
		// Last resort: reencode the string
		std::basic_string<OutCharT> result;
		InViewT in_string_view = static_cast<InViewT>(in_string);
		if constexpr (sizeof(InCharT) <= sizeof(OutCharT)) {
			// When copying to a larger type, we will need _at most_ as many elements as the smaller storage type
			result.reserve(in_string_view.size());
		}
		else {
			result.reserve(in_string_view.size() * (sizeof(OutCharT) / sizeof(InCharT)));
		}

		while (!in_string_view.empty()) {
			decode_result string_front = decode_codepoint(in_string_view);
			if (string_front.units == 0) {
				return {};
			}
			in_string_view.remove_prefix(string_front.units);

			encode_codepoint(result, string_front.codepoint);
		}

		return result;
	}
}